

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenize.c
# Opt level: O0

void dmrC_show_identifier_stats(dmr_C *C)

{
  int local_1b4;
  ident *piStack_1b0;
  int count;
  ident *ident;
  int distribution [100];
  int i;
  dmr_C *C_local;
  
  fprintf(_stderr,"identifiers: %d hits, %d misses\n",(ulong)(uint)C->T->ident_hit,
          (ulong)(uint)C->T->ident_miss);
  for (distribution[99] = 0; distribution[99] < 100; distribution[99] = distribution[99] + 1) {
    distribution[(long)distribution[99] + -2] = 0;
  }
  for (distribution[99] = 0; distribution[99] < 0x2000; distribution[99] = distribution[99] + 1) {
    piStack_1b0 = C->T->hash_table[distribution[99]];
    local_1b4 = 0;
    for (; piStack_1b0 != (ident *)0x0; piStack_1b0 = piStack_1b0->next) {
      local_1b4 = local_1b4 + 1;
    }
    if (99 < local_1b4) {
      local_1b4 = 99;
    }
    distribution[(long)local_1b4 + -2] = distribution[(long)local_1b4 + -2] + 1;
  }
  for (distribution[99] = 0; distribution[99] < 100; distribution[99] = distribution[99] + 1) {
    if (distribution[(long)distribution[99] + -2] != 0) {
      fprintf(_stderr,"%2d: %d buckets\n",(ulong)(uint)distribution[99],
              (ulong)(uint)distribution[(long)distribution[99] + -2]);
    }
  }
  return;
}

Assistant:

void dmrC_show_identifier_stats(struct dmr_C *C)
{
	int i;
	int distribution[100];

	fprintf(stderr, "identifiers: %d hits, %d misses\n", 
		C->T->ident_hit, C->T->ident_miss);

	for (i = 0; i < 100; i++)
		distribution[i] = 0;

	for (i = 0; i < IDENT_HASH_SIZE; i++) {
		struct ident *ident = C->T->hash_table[i];
		int count = 0;

		while (ident) {
			count++;
			ident = ident->next;
		}
		if (count > 99)
			count = 99;
		distribution[count]++;
	}

	for (i = 0; i < 100; i++) {
		if (distribution[i])
			fprintf(stderr, "%2d: %d buckets\n", i,
				distribution[i]);
	}
}